

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O2

void __thiscall
iu_StringViewSplit_x_iutest_x_chain_front_by_stl_str_view_Test<char>::Body
          (iu_StringViewSplit_x_iutest_x_chain_front_by_stl_str_view_Test<char> *this)

{
  basic_string_view<char,_std::char_traits<char>_> *in_R9;
  char *local_208;
  iuCodeMessage local_200;
  AssertionResult iutest_ar;
  basic_string_view<char,_std::char_traits<char>_> s;
  undefined1 local_198 [16];
  size_t local_188;
  
  s._M_len = 0x13;
  s._M_str = "arikitari na_world!";
  local_208 = "arikitari";
  local_198._0_8_ = 2;
  local_198._8_8_ = "_ ";
  local_188 = 0;
  local_200.m_message._0_16_ =
       detail::
       operator|<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_false,_false,_nullptr>
                 (&s,(split_helper_index<std::basic_string_view<char,_std::char_traits<char>_>,_false,_false,_false>
                      *)local_198);
  iutest::internal::CmpHelperEQ<char_const*,std::basic_string_view<char,std::char_traits<char>>>
            (&iutest_ar,(internal *)"constant::arikitari<char_type>()","s | split(delim) >> front()"
             ,(char *)&local_208,(char **)&local_200,in_R9);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_200,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
               ,0x2b,iutest_ar.m_message._M_dataplus._M_p);
    local_200._44_4_ = 2;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_200,(Fixed *)local_198);
    std::__cxx11::string::~string((string *)&local_200);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, chain_front_by_stl_str_view)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	const std::basic_string_view<char_type> delim = constant::space_underscore<char_type>();
	IUTEST_ASSERT_EQ(constant::arikitari<char_type>(), s | split(delim) >> front());
}